

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void StatInit(SuperLUStat_t *stat)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  flops_t *pfVar4;
  int local_22c;
  char local_228 [8];
  char msg_1 [256];
  char msg [256];
  int relax;
  int panel_size;
  int w;
  int i;
  SuperLUStat_t *stat_local;
  
  iVar1 = sp_ienv(1);
  local_22c = sp_ienv(2);
  if (local_22c < iVar1) {
    local_22c = iVar1;
  }
  piVar2 = int32Calloc(local_22c + 1);
  stat->panel_histo = piVar2;
  pdVar3 = (double *)superlu_malloc(0xb0);
  stat->utime = pdVar3;
  if (stat->utime == (double *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for stat->utime",0x172,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  pfVar4 = (flops_t *)superlu_malloc(0x58);
  stat->ops = pfVar4;
  if (stat->ops == (flops_t *)0x0) {
    sprintf(local_228,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for stat->ops",0x174,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
    superlu_abort_and_exit(local_228);
  }
  for (panel_size = 0; panel_size < 0x16; panel_size = panel_size + 1) {
    stat->utime[panel_size] = 0.0;
    stat->ops[panel_size] = 0.0;
  }
  stat->TinyPivots = 0;
  stat->RefineSteps = 0;
  stat->expansions = 0;
  return;
}

Assistant:

void
StatInit(SuperLUStat_t *stat)
{
    register int i, w, panel_size, relax;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);
    w = SUPERLU_MAX(panel_size, relax);
    stat->panel_histo = int32Calloc(w+1);
    stat->utime = (double *) SUPERLU_MALLOC(NPHASES * sizeof(double));
    if (!stat->utime) ABORT("SUPERLU_MALLOC fails for stat->utime");
    stat->ops = (flops_t *) SUPERLU_MALLOC(NPHASES * sizeof(flops_t));
    if (!stat->ops) ABORT("SUPERLU_MALLOC fails for stat->ops");
    for (i = 0; i < NPHASES; ++i) {
        stat->utime[i] = 0.;
        stat->ops[i] = 0.;
    }
    stat->TinyPivots = 0;
    stat->RefineSteps = 0;
    stat->expansions = 0;
#if ( PRNTlevel >= 1 )
    printf(".. parameters in sp_ienv():\n");
    printf("\t 1: panel size \t %4d \n"
           "\t 2: relax      \t %4d \n"
           "\t 3: max. super \t %4d \n"
           "\t 4: row-dim 2D \t %4d \n"
           "\t 5: col-dim 2D \t %4d \n"
           "\t 6: fill ratio \t %4d \n",
	   sp_ienv(1), sp_ienv(2), sp_ienv(3), 
	   sp_ienv(4), sp_ienv(5), sp_ienv(6));
#endif
}